

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O0

TransformNode * __thiscall
rengine::AllocationPool<rengine::TransformNode>::allocate
          (AllocationPool<rengine::TransformNode> *this)

{
  uint uVar1;
  TransformNode *pTVar2;
  bool bVar3;
  TransformNode *t;
  AllocationPool<rengine::TransformNode> *this_local;
  
  bVar3 = isExhausted(this);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
                 );
  }
  if (this->m_memory == (TransformNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
                 );
  }
  if (this->m_free == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
                 );
  }
  if (this->m_free[this->m_nextFree] < this->m_poolSize) {
    pTVar2 = this->m_memory;
    uVar1 = this->m_nextFree;
    this->m_nextFree = uVar1 + 1;
    uVar1 = this->m_free[uVar1];
    TransformNode::TransformNode(pTVar2 + uVar1);
    return pTVar2 + uVar1;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::TransformNode>::allocate() [T = rengine::TransformNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }